

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowReturnRows(Parse *pParse,Window *pMWin,int regCtr,int regGosub,int addrGosub,
                     int regInvArg,int regInvSize)

{
  int p2;
  Vdbe *p;
  
  p = sqlite3GetVdbe(pParse);
  windowAggFinal(pParse,pMWin,0);
  p2 = sqlite3VdbeAddOp3(p,0x2f,regCtr,p->nOp + 2,1);
  sqlite3VdbeAddOp2(p,0xb,0,0);
  windowReturnOneRow(pParse,pMWin,regGosub,addrGosub);
  if (regInvArg != 0) {
    windowAggStep(pParse,pMWin,pMWin->iEphCsr,1,regInvArg,regInvSize);
  }
  sqlite3VdbeAddOp2(p,5,pMWin->iEphCsr,p2);
  sqlite3VdbeJumpHere(p,p2 + 1);
  return;
}

Assistant:

static void windowReturnRows(
  Parse *pParse,
  Window *pMWin,                  /* List of window functions */
  int regCtr,                     /* Register containing number of rows */
  int regGosub,                   /* Register for Gosub addrGosub */
  int addrGosub,                  /* Address of sub-routine for ReturnOneRow */
  int regInvArg,                  /* Array of registers for xInverse args */
  int regInvSize                  /* Register containing size of partition */
){
  int addr;
  Vdbe *v = sqlite3GetVdbe(pParse);
  windowAggFinal(pParse, pMWin, 0);
  addr = sqlite3VdbeAddOp3(v, OP_IfPos, regCtr, sqlite3VdbeCurrentAddr(v)+2 ,1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Goto, 0, 0);
  windowReturnOneRow(pParse, pMWin, regGosub, addrGosub);
  if( regInvArg ){
    windowAggStep(pParse, pMWin, pMWin->iEphCsr, 1, regInvArg, regInvSize);
  }
  sqlite3VdbeAddOp2(v, OP_Next, pMWin->iEphCsr, addr);
  VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr+1);   /* The OP_Goto */
}